

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

bool __thiscall Raytracer::Sphere::isRayIntersect(Sphere *this,Ray *rayon,Vec3f *p)

{
  float fVar1;
  float fVar2;
  double t2;
  double t1;
  float delta;
  float local_50;
  float c;
  Vec3<float> local_3c;
  float local_30;
  float local_2c;
  float b;
  float a;
  Vec3f *p_local;
  Ray *rayon_local;
  Sphere *this_local;
  
  local_2c = 1.0;
  _b = p;
  p_local = &rayon->origin;
  rayon_local = (Ray *)this;
  Vec3<float>::operator-(&local_3c,&rayon->origin);
  fVar1 = Vec3<float>::operator*(&rayon->dir,&local_3c);
  Vec3<float>::~Vec3(&local_3c);
  local_30 = fVar1 + fVar1;
  Vec3<float>::operator-((Vec3<float> *)((long)&t1 + 4),p_local);
  fVar1 = Vec3<float>::norm((Vec3<float> *)((long)&t1 + 4));
  fVar1 = -this->radius * this->radius + fVar1;
  Vec3<float>::~Vec3((Vec3<float> *)((long)&t1 + 4));
  t1._0_4_ = local_30 * local_30 + -(local_2c * 4.0 * fVar1);
  if (0.0 <= t1._0_4_) {
    local_50 = fVar1;
    sqrtf(t1._0_4_);
    fVar1 = -local_30;
    fVar2 = sqrtf(t1._0_4_);
    if (fVar1 + fVar2 / (local_2c * 2.0) <= 0.0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Raytracer::Sphere::isRayIntersect(const Ray &rayon, Vec3f& p){

    float a = 1;
    float b = 2 * (rayon.dir * (rayon.origin - center));
    float c = (rayon.origin -center ).norm() - radius * radius;

    float delta = b*b - 4 *a*c;
    if(delta <0) return false;
    double t1 =(-b - sqrtf(delta) / (2*a));
    double t2 =(-b + sqrtf(delta) / (2*a));
    if(t2 > 0) return true;

    return false;
}